

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ftp_file_open(char *url,int rwmode,int *handle)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int local_9b0;
  int iStack_9ac;
  char firstchar;
  int status;
  int flen;
  int ii;
  int sock;
  long len;
  char recbuf [1200];
  char errorstr [1200];
  FILE *command;
  FILE *ftpfile;
  int *handle_local;
  char *pcStack_18;
  int rwmode_local;
  char *url_local;
  
  ftpfile = (FILE *)handle;
  handle_local._4_4_ = rwmode;
  pcStack_18 = url;
  iVar1 = strncmp(netoutfile,"mem:",4);
  if (iVar1 == 0) {
    iVar1 = ftp_open(pcStack_18,0,&ftpfile->_flags);
    return iVar1;
  }
  closeftpfile = 0;
  closecommandfile = 0;
  closefile = 0;
  closeoutfile = 0;
  sVar2 = strlen(netoutfile);
  iStack_9ac = (int)sVar2;
  if (iStack_9ac == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (ftp_file_open)");
    return 0x68;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 == 0) {
    signal(0xe,signal_handler);
    alarm(net_timeout);
    local_9b0 = ftp_open_network(pcStack_18,&command,(FILE **)(errorstr + 0x4a8),&flen);
    if (local_9b0 == 0) {
      closeftpfile = closeftpfile + 1;
      closecommandfile = closecommandfile + 1;
      iVar1 = 0;
      if (netoutfile[0] == '!') {
        for (status = 0; status < iStack_9ac; status = status + 1) {
          netoutfile[status] = netoutfile[status + 1];
        }
        iVar1 = file_remove(netoutfile);
      }
      local_9b0 = iVar1;
      iVar1 = fgetc((FILE *)command);
      ungetc((int)(char)iVar1,(FILE *)command);
      pcVar3 = strstr(pcStack_18,".gz");
      if (((pcVar3 == (char *)0x0) && (pcVar3 = strstr(pcStack_18,".Z"), pcVar3 == (char *)0x0)) &&
         ((char)iVar1 != '\x1f')) {
        local_9b0 = file_create(netoutfile,&ftpfile->_flags);
        if (local_9b0 == 0) {
          closefile = closefile + 1;
          alarm(net_timeout);
          while (_ii = fread(&len,1,0x4b0,(FILE *)command), _ii != 0) {
            alarm(0);
            local_9b0 = file_write(ftpfile->_flags,&len,_ii);
            if (local_9b0 != 0) {
              ffpmsg("Error writing file (ftp_file_open)");
              ffpmsg(pcStack_18);
              ffpmsg(netoutfile);
              goto LAB_0014027c;
            }
            alarm(net_timeout);
          }
          file_close(ftpfile->_flags);
LAB_00140203:
          fclose((FILE *)command);
          closeftpfile = closeftpfile + -1;
          fclose((FILE *)errorstr._1192_8_);
          NET_SendRaw(flen,"QUIT\r\n",6,0);
          closecommandfile = closecommandfile + -1;
          signal(0xe,(__sighandler_t)0x0);
          alarm(0);
          iVar1 = file_open(netoutfile,handle_local._4_4_,&ftpfile->_flags);
          return iVar1;
        }
        ffpmsg("Unable to create output file (ftp_file_open)");
        ffpmsg(netoutfile);
      }
      else {
        local_9b0 = file_create(netoutfile,&ftpfile->_flags);
        if (local_9b0 == 0) {
          file_close(ftpfile->_flags);
          outfile = (FILE *)fopen(netoutfile,"w");
          if ((FILE *)outfile == (FILE *)0x0) {
            ffpmsg("Unable to reopen the output file (ftp_file_open)");
            ffpmsg(netoutfile);
          }
          else {
            closeoutfile = closeoutfile + 1;
            local_9b0 = 0;
            alarm(net_timeout * 10);
            local_9b0 = uncompress2file(pcStack_18,command,outfile,&local_9b0);
            alarm(0);
            if (local_9b0 == 0) {
              fclose((FILE *)outfile);
              closeoutfile = closeoutfile + -1;
              goto LAB_00140203;
            }
            ffpmsg("Unable to uncompress the output file (ftp_file_open)");
            ffpmsg(pcStack_18);
            ffpmsg(netoutfile);
          }
        }
        else {
          ffpmsg("Unable to create output file (ftp_file_open)");
          ffpmsg(netoutfile);
        }
      }
    }
    else {
      alarm(0);
      ffpmsg("Unable to open http file (ftp_file_open)");
      ffpmsg(pcStack_18);
    }
  }
  else {
    ffpmsg("Timeout (ftp_file_open)");
    snprintf(recbuf + 0x4a8,0x4b0,"Download timeout exceeded: %d seconds");
    ffpmsg(recbuf + 0x4a8);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
  }
LAB_0014027c:
  alarm(0);
  if (closeftpfile != 0) {
    fclose((FILE *)command);
  }
  if (closecommandfile != 0) {
    fclose((FILE *)errorstr._1192_8_);
    NET_SendRaw(flen,"QUIT\r\n",6,0);
  }
  if (closeoutfile != 0) {
    fclose((FILE *)outfile);
  }
  if (closefile != 0) {
    file_close(ftpfile->_flags);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int ftp_file_open(char *url, int rwmode, int *handle)
{
  FILE *ftpfile;
  FILE *command;
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int sock;
  int ii, flen, status;
  char firstchar;

  /* Check if output file is actually a memory file */
  if (!strncmp(netoutfile, "mem:", 4) )
  {
     /* allow the memory file to be opened with write access */
     return( ftp_open(url, READONLY, handle) );
  }     

  closeftpfile = 0;
  closecommandfile = 0;
  closefile = 0;
  closeoutfile = 0;
  
  /* cfileio made a mistake, need to know where to write the output file */
  flen = strlen(netoutfile);
  if (!flen) 
    {
      ffpmsg("Output file not set, shouldn't have happened (ftp_file_open)");
      return (FILE_NOT_OPENED);
    }

  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (ftp_file_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   (multiplied x10 for files requiring uncompression)");
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }

  signal(SIGALRM, signal_handler);
  
  /* open the network connection to url. ftpfile holds the connection to
     the input file, command holds the connection to port 21, and sock is 
     the socket connected to port 21 */

  alarm(net_timeout);
  if ((status = ftp_open_network(url,&ftpfile,&command,&sock))) {
    alarm(0);
    ffpmsg("Unable to open http file (ftp_file_open)");
    ffpmsg(url);
    goto error;
  }
  closeftpfile++;
  closecommandfile++;

  if (*netoutfile == '!')
  {
     /* user wants to clobber file, if it already exists */
     for (ii = 0; ii < flen; ii++)
         netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

     status = file_remove(netoutfile);
  }

  /* Now, what do we do with the file */
  firstchar = fgetc(ftpfile);
  ungetc(firstchar,ftpfile);

  if (strstr(url,".gz") || 
      strstr(url,".Z") ||
      ('\037' == firstchar)) {

    /* to make this more cfitsioish we use the file driver calls to create
       the file */
    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (ftp_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }

    file_close(*handle);
    if (NULL == (outfile = fopen(netoutfile,"w"))) {
      ffpmsg("Unable to reopen the output file (ftp_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closeoutfile++;
    status = 0;

    /* Ok, this is a tough case, let's be arbritary and say 10*net_timeout,
       Given the choices for nettimeout above they'll probaby ^C before, but
       it's always worth a shot*/

    alarm(net_timeout*10);
    status = uncompress2file(url,ftpfile,outfile,&status);
    alarm(0);
    if (status) {
      ffpmsg("Unable to uncompress the output file (ftp_file_open)");
      ffpmsg(url);
      ffpmsg(netoutfile);
      goto error;
    }
    fclose(outfile);
    closeoutfile--;

  } else {
    
    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (ftp_file_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closefile++;
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,ftpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing file (ftp_file_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
      alarm(net_timeout);
    }
    file_close(*handle);
  }
  fclose(ftpfile);
  closeftpfile--;
  
  fclose(command);
  NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  closecommandfile--;

  signal(SIGALRM, SIG_DFL);
  alarm(0);

  return file_open(netoutfile,rwmode,handle);

 error:
  alarm(0); /* clear it */
  if (closeftpfile) {
    fclose(ftpfile);
  }
  if (closecommandfile) {
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  }
  if (closeoutfile) {
    fclose(outfile);
  }
  if (closefile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}